

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

void __thiscall LogStream::formatInteger<long_long>(LogStream *this,longlong v)

{
  int iVar1;
  char *buf;
  size_t len_00;
  size_t len;
  longlong v_local;
  LogStream *this_local;
  
  iVar1 = FixedBuffer<4000>::avail(&this->buffer_);
  if (0x1f < iVar1) {
    buf = FixedBuffer<4000>::current(&this->buffer_);
    len_00 = convert<long_long>(buf,v);
    FixedBuffer<4000>::add(&this->buffer_,len_00);
  }
  return;
}

Assistant:

void LogStream::formatInteger(T v) {
    if (buffer_.avail() >= kMaxNumericSize) {
        size_t len = convert(buffer_.current(), v);
        buffer_.add(len);
    }
}